

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArray.h
# Opt level: O1

void __thiscall
FIX::shared_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::release(shared_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  long *plVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  long *plVar5;
  atomic_count *counter;
  long lVar6;
  
  pbVar3 = this->m_buffer;
  if (pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    LOCK();
    iVar2 = *(int *)&(pbVar3->_M_dataplus)._M_p;
    *(int *)&(pbVar3->_M_dataplus)._M_p = *(int *)&(pbVar3->_M_dataplus)._M_p + -1;
    UNLOCK();
    if (iVar2 == 1) {
      pbVar3 = this->m_buffer;
      this->m_size = 0;
      this->m_buffer = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        lVar4 = *(long *)((long)&pbVar3[-1].field_2 + 8);
        if (lVar4 != 0) {
          lVar6 = lVar4 << 5;
          do {
            plVar1 = (long *)((long)pbVar3 + lVar6 + -0x10);
            plVar5 = *(long **)((long)&pbVar3[-1]._M_dataplus._M_p + lVar6);
            if (plVar1 != plVar5) {
              operator_delete(plVar5,*plVar1 + 1);
            }
            lVar6 = lVar6 + -0x20;
          } while (lVar6 != 0);
        }
        operator_delete__((void *)((long)&pbVar3[-1].field_2 + 8),lVar4 << 5 | 8);
        return;
      }
    }
  }
  return;
}

Assistant:

bool empty() const
    { return m_buffer == 0; }